

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

bool __thiscall
glslang::TSmallArrayVector::operator==(TSmallArrayVector *this,TSmallArrayVector *rhs)

{
  TSmallArrayVector *rhs_local;
  TSmallArrayVector *this_local;
  
  if ((this->sizes == (TVector<glslang::TArraySize> *)0x0) &&
     (rhs->sizes == (TVector<glslang::TArraySize> *)0x0)) {
    this_local._7_1_ = true;
  }
  else if ((this->sizes == (TVector<glslang::TArraySize> *)0x0) ||
          (rhs->sizes == (TVector<glslang::TArraySize> *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         std::operator==(&this->sizes->
                          super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                         ,&rhs->sizes->
                           super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                        );
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const TSmallArrayVector& rhs) const
    {
        if (sizes == nullptr && rhs.sizes == nullptr)
            return true;
        if (sizes == nullptr || rhs.sizes == nullptr)
            return false;
        return *sizes == *rhs.sizes;
    }